

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall specialOps_degC_Test::TestBody(specialOps_degC_Test *this)

{
  uint extraout_EAX;
  char *message;
  double in_XMM1_Qa;
  precise_unit res;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  precise_unit local_38;
  double local_28;
  precise_unit local_20;
  
  local_28 = units::detail::power_const<double>(1.0,2);
  units::detail::unit_data::pow((unit_data *)(units::precise::degC + 8),local_28,in_XMM1_Qa);
  local_20._8_8_ = ZEXT48(extraout_EAX);
  local_20.multiplier_ = local_28;
  local_38 = units::root(&local_20,2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_48,"root(res, 2)","precise::degC",&local_38,(precise_unit *)units::precise::degC)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x357,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.multiplier_ + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST(specialOps, degC)
{
    auto res = precise::degC.pow(2);
    EXPECT_EQ(root(res, 2), precise::degC);
}